

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O1

CBNode * __thiscall asmjit::CodeBuilder::addBefore(CodeBuilder *this,CBNode *node,CBNode *ref)

{
  CBNode *pCVar1;
  void *pvVar2;
  CBNode *pCVar3;
  CBNode *extraout_RAX;
  CBNode *pCVar4;
  CBNode **ppCVar5;
  CBNode *pCVar6;
  CBNode *extraout_RDX;
  bool bVar7;
  
  if (node == (CBNode *)0x0) {
    addBefore();
LAB_00112944:
    addBefore();
  }
  else {
    if (node->_prev != (CBNode *)0x0) goto LAB_00112944;
    if (node->_next == (CBNode *)0x0) {
      if (ref != (CBNode *)0x0) {
        pCVar4 = ref->_prev;
        node->_prev = pCVar4;
        node->_next = ref;
        ref->_prev = node;
        ppCVar5 = &pCVar4->_next;
        if (pCVar4 == (CBNode *)0x0) {
          ppCVar5 = &this->_firstNode;
        }
        *ppCVar5 = node;
        return node;
      }
      goto LAB_0011294e;
    }
  }
  addBefore();
LAB_0011294e:
  addBefore();
  pCVar4 = node->_prev;
  ppCVar5 = &pCVar4->_next;
  if (this->_firstNode == node) {
    ppCVar5 = &this->_firstNode;
  }
  pCVar1 = node->_next;
  *ppCVar5 = pCVar1;
  pCVar6 = (CBNode *)&this->_lastNode;
  if (this->_lastNode != node) {
    pCVar6 = pCVar1;
  }
  pCVar6->_prev = pCVar4;
  node->_prev = (CBNode *)0x0;
  node->_next = (CBNode *)0x0;
  if (this->_cursor == node) {
    this->_cursor = pCVar4;
  }
  if (((node->_flags & 0x30) == 0) || (pvVar2 = node[1]._passData, pvVar2 == (void *)0x0)) {
    return node;
  }
  pCVar4 = (CBNode *)((long)pvVar2 + 0x30);
  while (pCVar1 = pCVar4->_prev, pCVar1 != (CBNode *)0x0) {
    if (pCVar1 == node) {
      pCVar4->_prev = node[2]._prev;
      *(int *)((long)pvVar2 + 0x2c) = *(int *)((long)pvVar2 + 0x2c) + -1;
      return node;
    }
    pCVar4 = pCVar1 + 2;
  }
  removeNode();
  if (node == extraout_RDX) {
    pCVar4 = removeNode(this,node);
    return pCVar4;
  }
  pCVar4 = node->_prev;
  pCVar1 = extraout_RDX->_next;
  ppCVar5 = &pCVar4->_next;
  if (this->_firstNode == node) {
    ppCVar5 = &this->_firstNode;
  }
  *ppCVar5 = pCVar1;
  pCVar6 = (CBNode *)&this->_lastNode;
  if (this->_lastNode != extraout_RDX) {
    pCVar6 = pCVar1;
  }
  pCVar6->_prev = pCVar4;
  do {
    pCVar1 = node->_next;
    if (pCVar1 == (CBNode *)0x0) {
LAB_00112a8a:
      removeNodes();
      pCVar4 = this->_cursor;
      this->_cursor = node;
      return pCVar4;
    }
    node->_prev = (CBNode *)0x0;
    node->_next = (CBNode *)0x0;
    if (this->_cursor == node) {
      this->_cursor = pCVar4;
    }
    if (((node->_flags & 0x30) != 0) && (pvVar2 = node[1]._passData, pvVar2 != (void *)0x0)) {
      pCVar6 = (CBNode *)((long)pvVar2 + 0x30);
      while( true ) {
        pCVar3 = pCVar6->_prev;
        if (pCVar3 == (CBNode *)0x0) {
          removeNodes();
          goto LAB_00112a8a;
        }
        if (pCVar3 == node) break;
        pCVar6 = pCVar3 + 2;
      }
      pCVar6->_prev = node[2]._prev;
      *(int *)((long)pvVar2 + 0x2c) = *(int *)((long)pvVar2 + 0x2c) + -1;
    }
    bVar7 = node == extraout_RDX;
    node = pCVar1;
    if (bVar7) {
      return extraout_RAX;
    }
  } while( true );
}

Assistant:

CBNode* CodeBuilder::addBefore(CBNode* node, CBNode* ref) noexcept {
  ASMJIT_ASSERT(node != nullptr);
  ASMJIT_ASSERT(node->_prev == nullptr);
  ASMJIT_ASSERT(node->_next == nullptr);
  ASMJIT_ASSERT(ref != nullptr);

  CBNode* prev = ref->_prev;
  CBNode* next = ref;

  node->_prev = prev;
  node->_next = next;

  next->_prev = node;
  if (prev)
    prev->_next = node;
  else
    _firstNode = node;

  return node;
}